

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_device.c
# Opt level: O1

int device_main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  int ip_mode;
  uint portTemp;
  int local_50;
  int local_4c;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_4c = 0;
  local_50 = 1;
  SampleUtil_Initialize(linux_print);
  if (argc < 2) {
    local_38 = (char *)0x0;
    local_40 = (char *)0x0;
    local_48 = (char *)0x0;
  }
  else {
    iVar6 = 1;
    local_48 = (char *)0x0;
    local_40 = (char *)0x0;
    local_38 = (char *)0x0;
    do {
      pcVar5 = argv[iVar6];
      iVar1 = strcmp(pcVar5,"-i");
      if (iVar1 == 0) {
        iVar1 = iVar6 + 1;
        local_38 = argv[(long)iVar6 + 1];
      }
      else {
        iVar1 = strcmp(pcVar5,"-port");
        if (iVar1 == 0) {
          pcVar5 = argv[(long)iVar6 + 1];
          pcVar4 = "%u";
          piVar3 = &local_4c;
LAB_00106096:
          iVar1 = iVar6 + 1;
          __isoc99_sscanf(pcVar5,pcVar4,piVar3);
        }
        else {
          iVar1 = strcmp(pcVar5,"-desc");
          if (iVar1 == 0) {
            iVar1 = iVar6 + 1;
            local_40 = argv[(long)iVar6 + 1];
          }
          else {
            iVar1 = strcmp(pcVar5,"-webdir");
            if (iVar1 == 0) {
              iVar1 = iVar6 + 1;
              local_48 = argv[(long)iVar6 + 1];
            }
            else {
              iVar1 = strcmp(pcVar5,"-m");
              if (iVar1 == 0) {
                pcVar5 = argv[(long)iVar6 + 1];
                pcVar4 = "%d";
                piVar3 = &local_50;
                goto LAB_00106096;
              }
              iVar2 = strcmp(pcVar5,"-help");
              iVar1 = iVar6;
              if (iVar2 == 0) {
                SampleUtil_Print("Usage: %s -i interface -port port -desc desc_doc_name -webdir web_dir_path -m ip_mode -help (this message)\n"
                                 ,*argv);
                SampleUtil_Print(
                                "\tinterface:     interface address of the device (must match desc. doc)\n\t\te.g.: eth0\n\tport:          Port number to use for receiving UPnP messages (must match desc. doc)\n\t\te.g.: 5431\n\tdesc_doc_name: name of device description document\n\t\te.g.: tvdevicedesc.xml\n\tweb_dir_path:  Filesystem path where web files related to the device are stored\n\t\te.g.: /upnp/sample/tvdevice/web\n\tip_mode:       set to 1 for IPv4 (default), 2 for IPv6 LLA and 3 for IPv6 ULA or GUA\n"
                                );
                return 1;
              }
            }
          }
        }
      }
      iVar6 = iVar1 + 1;
    } while (iVar6 < argc);
  }
  iVar6 = TvDeviceStart(local_38,(unsigned_short)local_4c,local_40,local_48,local_50,linux_print,0);
  return iVar6;
}

Assistant:

int device_main(int argc, char *argv[])
{
	unsigned int portTemp = 0;
	char *iface = NULL;
	char *desc_doc_name = NULL;
	char *web_dir_path = NULL;
	unsigned short port = 0;
	int ip_mode = IP_MODE_IPV4;
	int i = 0;

	SampleUtil_Initialize(linux_print);
	/* Parse options */
	for (i = 1; i < argc; i++) {
		if (strcmp(argv[i], "-i") == 0) {
			iface = argv[++i];
		} else if (strcmp(argv[i], "-port") == 0) {
#ifdef WIN32
			sscanf_s(argv[++i], "%u", &portTemp);
#else
			sscanf(argv[++i], "%u", &portTemp);
#endif
		} else if (strcmp(argv[i], "-desc") == 0) {
			desc_doc_name = argv[++i];
		} else if (strcmp(argv[i], "-webdir") == 0) {
			web_dir_path = argv[++i];
		} else if (strcmp(argv[i], "-m") == 0) {
#ifdef _WIN32
			sscanf_s(argv[++i], "%d", &ip_mode);
#else
			sscanf(argv[++i], "%d", &ip_mode);
#endif
		} else if (strcmp(argv[i], "-help") == 0) {
			SampleUtil_Print(
				"Usage: %s -i interface -port port"
				" -desc desc_doc_name -webdir web_dir_path"
				" -m ip_mode -help (this message)\n",
				argv[0]);
			SampleUtil_Print(
				"\tinterface:     interface address of the "
				"device"
				" (must match desc. doc)\n"
				"\t\te.g.: eth0\n"
				"\tport:          Port number to use for"
				" receiving UPnP messages (must match desc. "
				"doc)\n"
				"\t\te.g.: 5431\n"
				"\tdesc_doc_name: name of device description "
				"document\n"
				"\t\te.g.: tvdevicedesc.xml\n"
				"\tweb_dir_path:  Filesystem path where web "
				"files"
				" related to the device are stored\n"
				"\t\te.g.: /upnp/sample/tvdevice/web\n"
				"\tip_mode:       set to 1 for IPv4 (default), "
				"2 for IPv6 LLA and 3 for IPv6 ULA or GUA\n");
			return 1;
		}
	}
	port = (unsigned short)portTemp;
	return TvDeviceStart(iface,
		port,
		desc_doc_name,
		web_dir_path,
		ip_mode,
		linux_print,
		0);
}